

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelativeOffset.cpp
# Opt level: O1

ValueNumber __thiscall ValueRelativeOffset::BaseValueNumber(ValueRelativeOffset *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->baseValue == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueRelativeOffset.cpp"
                       ,0x2c,"(IsValid())","IsValid()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return this->baseValue->valueNumber;
}

Assistant:

ValueNumber ValueRelativeOffset::BaseValueNumber() const
{
    Assert(IsValid());
    return baseValue->GetValueNumber();
}